

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O1

void rw::d3d::unlockVertices(void *vertexBuffer)

{
  return;
}

Assistant:

void
unlockVertices(void *vertexBuffer)
{
	if(vertexBuffer == nil)
		return;
#ifdef RW_D3D9
	IDirect3DVertexBuffer9 *vertbuf = (IDirect3DVertexBuffer9*)vertexBuffer;
	vertbuf->Unlock();
#endif
}